

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzquad.h
# Opt level: O1

void __thiscall TPZInt1Point::Point(TPZInt1Point *this,int ip,TPZVec<double> *pos,REAL *w)

{
  long *plVar1;
  
  if (ip != 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"TPZInt1Point:: Bad number point ",0x20);
    plVar1 = (long *)std::ostream::operator<<(&std::cout,ip);
    std::ios::widen((char)*(undefined8 *)(*plVar1 + -0x18) + (char)plVar1);
    std::ostream::put((char)plVar1);
    std::ostream::flush();
    return;
  }
  *w = 1.0;
  return;
}

Assistant:

inline void TPZInt1Point::Point(int ip, TPZVec<REAL> &pos, REAL &w) const {
#ifndef PZNODEBUG
	if(ip!=0) {
		std::cout << "TPZInt1Point:: Bad number point " << ip << std::endl;
		return;
	}
#endif
	w = 1.;
}